

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O1

void __thiscall QWaitCondition::~QWaitCondition(QWaitCondition *this)

{
  int iVar1;
  
  iVar1 = pthread_cond_destroy((pthread_cond_t *)&this->d->cond);
  if (iVar1 != 0) {
    qErrnoWarning(iVar1,"%s: %s failure","QWaitCondition","cv destroy");
  }
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)this->d);
  if (iVar1 != 0) {
    qErrnoWarning(iVar1,"%s: %s failure","QWaitCondition","mutex destroy");
  }
  if (this->d != (QWaitConditionPrivate *)0x0) {
    operator_delete(this->d,0x60);
    return;
  }
  return;
}

Assistant:

QWaitCondition::~QWaitCondition()
{
    qt_report_pthread_error(pthread_cond_destroy(&d->cond), "QWaitCondition", "cv destroy");
    qt_report_pthread_error(pthread_mutex_destroy(&d->mutex), "QWaitCondition", "mutex destroy");
    delete d;
}